

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void deleted_doc_stat_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  char *__format;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_doc _doc;
  timeval __test_begin;
  fdb_file_info info;
  char bodybuf [256];
  char keybuf [256];
  fdb_file_handle *local_3e0;
  fdb_kvs_handle *local_3d8;
  fdb_doc *local_3d0;
  fdb_doc local_3c8;
  fdb_kvs_config local_378;
  timeval local_360;
  fdb_file_info local_350;
  char local_308 [256];
  char local_208 [256];
  fdb_config local_108;
  
  gettimeofday(&local_360,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  local_3c8.size_ondisk = 0;
  local_3c8.meta = (void *)0x0;
  local_3c8.offset = 0;
  local_3c8.deleted = false;
  local_3c8._73_3_ = 0;
  local_3c8.flags = 0;
  local_3c8.metalen = 0;
  local_3c8.bodylen = 0;
  local_3c8.key = local_208;
  local_3c8.body = local_308;
  local_3c8.seqnum = 0xffffffffffffffff;
  fdb_get_default_config();
  local_108.purging_interval = 0;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&local_3e0,"./dummy1",&local_108);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x28c);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x28c,"void deleted_doc_stat_test()");
  }
  fVar1 = fdb_kvs_open(local_3e0,&local_3d8,"main",&local_378);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x28e);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x28e,"void deleted_doc_stat_test()");
  }
  local_208[0] = 'K';
  local_208[1] = '\0';
  builtin_strncpy(local_308,"body",5);
  sVar2 = strlen(local_208);
  local_3c8.keylen = sVar2 + 1;
  sVar2 = strlen(local_308);
  local_3c8.bodylen = sVar2 + 1;
  fVar1 = fdb_set(local_3d8,&local_3c8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x295);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x295,"void deleted_doc_stat_test()");
  }
  fVar1 = fdb_del(local_3d8,&local_3c8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x299);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x299,"void deleted_doc_stat_test()");
  }
  fdb_doc_create(&local_3d0,local_3c8.key,local_3c8.keylen,(void *)0x0,0,(void *)0x0,0);
  fVar1 = fdb_get(local_3d8,local_3d0);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x29e);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x29e,"void deleted_doc_stat_test()");
  }
  fdb_doc_free(local_3d0);
  fdb_get_file_info(local_3e0,&local_350);
  if (local_350.doc_count != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2a3);
    deleted_doc_stat_test()::__test_pass = '\x01';
    if (local_350.doc_count != 0) {
      __assert_fail("info.doc_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2a3,"void deleted_doc_stat_test()");
    }
  }
  fVar1 = fdb_commit(local_3e0,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2a6);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x2a6,"void deleted_doc_stat_test()");
  }
  fdb_get_file_info(local_3e0,&local_350);
  if (local_350.doc_count != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2a9);
    deleted_doc_stat_test()::__test_pass = '\x01';
    if (local_350.doc_count != 0) {
      __assert_fail("info.doc_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x2a9,"void deleted_doc_stat_test()");
    }
  }
  fVar1 = fdb_kvs_close(local_3d8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_close(local_3e0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"deleted doc stat test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x2ae);
    deleted_doc_stat_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x2ae,"void deleted_doc_stat_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x2ac);
  deleted_doc_stat_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x2ac,"void deleted_doc_stat_test()");
}

Assistant:

void deleted_doc_stat_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc _doc;
    fdb_doc *doc = &_doc;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_file_info info;
    fdb_kvs_config kvs_config;
    char keybuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    memset(doc, 0, sizeof(fdb_doc));
    doc->key = &keybuf[0];
    doc->body = &bodybuf[0];
    doc->seqnum = SEQNUM_NOT_USED;

    // open dbfile
    fconfig = fdb_get_default_config();
    fconfig.purging_interval = 0;
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, "main", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "K"); // This is necessary to set keysize to 2 bytes so
    sprintf(bodybuf, "body"); // it matches KV_header doc's keysize of 10
    doc->keylen = strlen(keybuf) + 1; // in multi-kv mode and hits MB-16491
    doc->bodylen = strlen(bodybuf) + 1;
    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Delete the doc
    status = fdb_del(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Fetch the doc back
    fdb_doc_create(&rdoc, doc->key, doc->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    fdb_doc_free(rdoc);

    // check the file info
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 0);

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check the file info again after commit..
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 0);

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("deleted doc stat test");
}